

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT(EnvironmentNAVXYTHETAMLEVLAT *this)

{
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *pvVar1;
  pointer psVar2;
  void *pvVar3;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *pvVar4;
  pointer psVar5;
  int iVar6;
  long lVar7;
  EnvNAVXYTHETAMLEVLATAddInfoAction_t **ppEVar8;
  uchar ***pppuVar9;
  long lVar10;
  long lVar11;
  pointer *ppsVar12;
  pointer *ppsVar13;
  
  (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation =
       (_func_int **)&PTR_InitializeEnv_00157b28;
  pvVar1 = this->AddLevelFootprintPolygonV;
  if (pvVar1 != (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0) {
    psVar2 = pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppsVar12 = &pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (psVar2 != (pointer)0x0) {
      lVar10 = (long)psVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar10);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)ppsVar12 + lVar10) - (long)pvVar3);
        }
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0);
    }
    operator_delete__(ppsVar12,(long)psVar2 * 0x18 + 8);
    this->AddLevelFootprintPolygonV = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0;
  }
  ppEVar8 = this->AdditionalInfoinActionsV;
  if (ppEVar8 != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) {
    if ((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
        EnvNAVXYTHETALATCfg.NumThetaDirs < 1) {
LAB_0012da1c:
      operator_delete__(ppEVar8);
    }
    else {
      lVar10 = 0;
      do {
        iVar6 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.actionwidth;
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            pvVar4 = this->AdditionalInfoinActionsV[lVar10][lVar11].intersectingcellsV;
            if (pvVar4 != (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x0) {
              psVar5 = pvVar4[-1].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppsVar13 = &pvVar4[-1].
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              if (psVar5 != (pointer)0x0) {
                lVar7 = (long)psVar5 * 0x18;
                do {
                  pvVar3 = *(void **)((long)&pvVar4[-1].
                                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar7);
                  if (pvVar3 != (void *)0x0) {
                    operator_delete(pvVar3,*(long *)((long)ppsVar13 + lVar7) - (long)pvVar3);
                  }
                  lVar7 = lVar7 + -0x18;
                } while (lVar7 != 0);
              }
              operator_delete__(ppsVar13,(long)psVar5 * 0x18 + 8);
              iVar6 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                      EnvNAVXYTHETALATCfg.actionwidth;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar6);
        }
        if (this->AdditionalInfoinActionsV[lVar10] != (EnvNAVXYTHETAMLEVLATAddInfoAction_t *)0x0) {
          operator_delete__(this->AdditionalInfoinActionsV[lVar10]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                        EnvNAVXYTHETALATCfg.NumThetaDirs);
      ppEVar8 = this->AdditionalInfoinActionsV;
      if (ppEVar8 != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) goto LAB_0012da1c;
    }
    this->AdditionalInfoinActionsV = (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0;
  }
  pppuVar9 = this->AddLevelGrid2D;
  if (pppuVar9 == (uchar ***)0x0) goto LAB_0012dab5;
  if (this->numofadditionalzlevs < 1) {
LAB_0012daa5:
    operator_delete__(pppuVar9);
  }
  else {
    lVar10 = 0;
    do {
      iVar6 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
              EnvNAVXYTHETALATCfg.EnvWidth_c;
      if (0 < iVar6) {
        lVar11 = 0;
        do {
          if (this->AddLevelGrid2D[lVar10][lVar11] != (uchar *)0x0) {
            operator_delete__(this->AddLevelGrid2D[lVar10][lVar11]);
            iVar6 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                    EnvNAVXYTHETALATCfg.EnvWidth_c;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar6);
      }
      if (this->AddLevelGrid2D[lVar10] != (uchar **)0x0) {
        operator_delete__(this->AddLevelGrid2D[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numofadditionalzlevs);
    pppuVar9 = this->AddLevelGrid2D;
    if (pppuVar9 != (uchar ***)0x0) goto LAB_0012daa5;
  }
  this->AddLevelGrid2D = (uchar ***)0x0;
LAB_0012dab5:
  if (this->AddLevel_cost_possibly_circumscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_possibly_circumscribed_thresh);
    this->AddLevel_cost_possibly_circumscribed_thresh = (uchar *)0x0;
  }
  if (this->AddLevel_cost_inscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_inscribed_thresh);
    this->AddLevel_cost_inscribed_thresh = (uchar *)0x0;
  }
  this->numofadditionalzlevs = 0;
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&this->super_EnvironmentNAVXYTHETALAT);
  return;
}

Assistant:

EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT()
{
    if (AddLevelFootprintPolygonV != NULL) {
        delete[] AddLevelFootprintPolygonV;
        AddLevelFootprintPolygonV = NULL;
    }

    if (AdditionalInfoinActionsV != NULL) {
        for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
            for (int aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
                delete[] AdditionalInfoinActionsV[tind][aind].intersectingcellsV;
            }
            delete[] AdditionalInfoinActionsV[tind];
        }
        delete[] AdditionalInfoinActionsV;
        AdditionalInfoinActionsV = NULL;
    }

    if (AddLevelGrid2D != NULL) {
        for (int levelind = 0; levelind < numofadditionalzlevs; levelind++) {
            for (int xind = 0; xind < EnvNAVXYTHETALATCfg.EnvWidth_c; xind++) {
                delete[] AddLevelGrid2D[levelind][xind];
            }
            delete[] AddLevelGrid2D[levelind];
        }
        delete[] AddLevelGrid2D;
        AddLevelGrid2D = NULL;
    }

    if (AddLevel_cost_possibly_circumscribed_thresh != NULL) {
        delete[] AddLevel_cost_possibly_circumscribed_thresh;
        AddLevel_cost_possibly_circumscribed_thresh = NULL;
    }

    if (AddLevel_cost_inscribed_thresh != NULL) {
        delete[] AddLevel_cost_inscribed_thresh;
        AddLevel_cost_inscribed_thresh = NULL;
    }

    //reset the number of additional levels
    numofadditionalzlevs = 0;
}